

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keepalive.c
# Opt level: O3

int libssh2_keepalive_send(LIBSSH2_SESSION *session,int *seconds_to_next)

{
  int iVar1;
  time_t tVar2;
  uchar keepalive_data [28];
  uchar auStack_48 [20];
  undefined8 uStack_34;
  
  if (session->keepalive_interval == 0) {
    if (seconds_to_next != (int *)0x0) {
      *seconds_to_next = 0;
    }
  }
  else {
    tVar2 = time((time_t *)0x0);
    if (tVar2 < session->keepalive_last_sent + (long)session->keepalive_interval) {
      if (seconds_to_next != (int *)0x0) {
        *seconds_to_next =
             ((int)session->keepalive_last_sent - (int)tVar2) + session->keepalive_interval;
      }
    }
    else {
      builtin_memcpy(auStack_48 + 0x10,"ibss",4);
      auStack_48[0] = 'P';
      auStack_48[1] = '\0';
      auStack_48[2] = '\0';
      auStack_48[3] = '\0';
      auStack_48[4] = '\x15';
      auStack_48[5] = 'k';
      auStack_48[6] = 'e';
      auStack_48[7] = 'e';
      auStack_48[8] = 'p';
      auStack_48[9] = 'a';
      auStack_48[10] = 'l';
      auStack_48[0xb] = 'i';
      auStack_48[0xc] = 'v';
      auStack_48[0xd] = 'e';
      auStack_48[0xe] = '@';
      auStack_48[0xf] = 'l';
      uStack_34 = (ulong)CONCAT16((char)session->keepalive_want_reply,0x67726f2e3268);
      iVar1 = _libssh2_transport_send(session,auStack_48,0x1b,(uchar *)0x0,0);
      if ((iVar1 == -0x25) || (iVar1 == 0)) {
        session->keepalive_last_sent = tVar2;
        if (seconds_to_next != (int *)0x0) {
          *seconds_to_next = session->keepalive_interval;
        }
      }
      else {
        _libssh2_error(session,-7,"Unable to send keepalive message");
      }
      if ((iVar1 != -0x25) && (iVar1 != 0)) {
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

LIBSSH2_API int
libssh2_keepalive_send(LIBSSH2_SESSION *session,
                       int *seconds_to_next)
{
    time_t now;

    if(!session->keepalive_interval) {
        if(seconds_to_next)
            *seconds_to_next = 0;
        return 0;
    }

    now = time(NULL);

    if(session->keepalive_last_sent + session->keepalive_interval <= now) {
        /* Format is
           "SSH_MSG_GLOBAL_REQUEST || 4-byte len || str || want-reply". */
        unsigned char keepalive_data[]
            = "\x50\x00\x00\x00\x15keepalive@libssh2.orgW";
        size_t len = sizeof(keepalive_data) - 1;
        int rc;

        keepalive_data[len - 1] =
            (unsigned char)session->keepalive_want_reply;

        rc = _libssh2_transport_send(session, keepalive_data, len, NULL, 0);
        /* Silently ignore PACKET_EAGAIN here: if the write buffer is
           already full, sending another keepalive is not useful. */
        if(rc && rc != LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                           "Unable to send keepalive message");
            return rc;
        }

        session->keepalive_last_sent = now;
        if(seconds_to_next)
            *seconds_to_next = session->keepalive_interval;
    }
    else if(seconds_to_next) {
        *seconds_to_next = (int) (session->keepalive_last_sent - now)
            + session->keepalive_interval;
    }

    return 0;
}